

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Utilities.h
# Opt level: O3

VariablesWithType * __thiscall
soul::heart::Utilities::VariableListByType::getType(VariableListByType *this,Type *typeNeeded)

{
  VariablesWithType *pVVar1;
  bool bVar2;
  vector<soul::heart::Utilities::VariableListByType::VariablesWithType,_std::allocator<soul::heart::Utilities::VariableListByType::VariablesWithType>_>
  *__range2;
  VariablesWithType *type;
  VariablesWithType *this_00;
  VariablesWithType local_50;
  
  this_00 = (this->types).
            super__Vector_base<soul::heart::Utilities::VariableListByType::VariablesWithType,_std::allocator<soul::heart::Utilities::VariableListByType::VariablesWithType>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pVVar1 = (this->types).
           super__Vector_base<soul::heart::Utilities::VariableListByType::VariablesWithType,_std::allocator<soul::heart::Utilities::VariableListByType::VariablesWithType>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (this_00 == pVVar1) {
      local_50.type.category = typeNeeded->category;
      local_50.type.arrayElementCategory = typeNeeded->arrayElementCategory;
      local_50.type.isRef = typeNeeded->isRef;
      local_50.type.isConstant = typeNeeded->isConstant;
      local_50.type.primitiveType.type = (typeNeeded->primitiveType).type;
      local_50.type.boundingSize = typeNeeded->boundingSize;
      local_50.type.arrayElementBoundingSize = typeNeeded->arrayElementBoundingSize;
      local_50.type.structure.object = (typeNeeded->structure).object;
      (typeNeeded->structure).object = (Structure *)0x0;
      local_50.variables.
      super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_50.variables.
      super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_50.variables.
      super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::
      vector<soul::heart::Utilities::VariableListByType::VariablesWithType,_std::allocator<soul::heart::Utilities::VariableListByType::VariablesWithType>_>
      ::emplace_back<soul::heart::Utilities::VariableListByType::VariablesWithType>
                (&this->types,&local_50);
      if (local_50.variables.
          super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_50.variables.
                        super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_50.variables.
                              super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_50.variables.
                              super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      RefCountedPtr<soul::Structure>::decIfNotNull(local_50.type.structure.object);
      return (this->types).
             super__Vector_base<soul::heart::Utilities::VariableListByType::VariablesWithType,_std::allocator<soul::heart::Utilities::VariableListByType::VariablesWithType>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
    }
    bVar2 = Type::isEqual(&this_00->type,typeNeeded,0);
    if (bVar2) break;
    this_00 = this_00 + 1;
  }
  return this_00;
}

Assistant:

VariablesWithType& getType (Type typeNeeded)
        {
            for (auto& type : types)
                if (type.type.isIdentical (typeNeeded))
                    return type;

            types.push_back ({ std::move (typeNeeded), {} });
            return types.back();
        }